

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

Constant * __thiscall
soul::PoolAllocator::allocate<soul::heart::Constant,soul::CodeLocation,soul::Value>
          (PoolAllocator *this,CodeLocation *args,Value *args_1)

{
  UTF8Reader *this_00;
  SourceCodeText *pSVar1;
  _lambda_void___1_ local_8d [13];
  Value local_80;
  CodeLocation local_40;
  Constant *local_30;
  Constant *newObject;
  PoolItem *newItem;
  Value *args_local_1;
  CodeLocation *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_1;
  args_local_1 = (Value *)args;
  args_local = (CodeLocation *)this;
  newObject = (Constant *)allocateSpaceForObject(this,0x58);
  this_00 = &(newObject->super_Expression).super_Object.location.location;
  CodeLocation::CodeLocation(&local_40,(CodeLocation *)args_local_1);
  soul::Value::Value(&local_80,(Value *)newItem);
  heart::Constant::Constant((Constant *)this_00,&local_40,&local_80);
  soul::Value::~Value(&local_80);
  CodeLocation::~CodeLocation(&local_40);
  local_30 = (Constant *)this_00;
  pSVar1 = (SourceCodeText *)
           allocate(soul::CodeLocation&&,soul::Value&&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(local_8d);
  (newObject->super_Expression).super_Object.location.sourceCode.object = pSVar1;
  return local_30;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }